

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void strdump(char *e,char *p,wchar_t ewidth,wchar_t utf8)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  size_t sVar5;
  byte *pbVar6;
  uint uVar7;
  int __c;
  char *fmt;
  long lVar8;
  uint uVar9;
  char *pcVar10;
  
  logprintf("      %*s = ",(ulong)(uint)ewidth,e);
  if (p == (char *)0x0) {
    pcVar10 = "NULL\n";
  }
  else {
    logprintf("\"");
    cVar3 = *p;
    if (cVar3 != '\0') {
      pcVar10 = p + 1;
      do {
        switch(cVar3) {
        case '\a':
          __c = 7;
          break;
        case '\b':
          __c = 8;
          break;
        default:
          if ((byte)(cVar3 - 0x20U) < 0x5f) {
            fmt = "%c";
          }
          else {
            fmt = "\\x%02X";
          }
          logprintf(fmt);
          goto LAB_001057e3;
        case '\n':
          __c = 10;
          break;
        case '\r':
          __c = 0xd;
        }
        putchar(__c);
LAB_001057e3:
        cVar3 = *pcVar10;
        pcVar10 = pcVar10 + 1;
      } while (cVar3 != '\0');
    }
    uVar7 = 0;
    logprintf("\"");
    sVar5 = strlen(p);
    logprintf(" (length %d)",sVar5 & 0xffffffff);
    pcVar10 = "\n";
    if (utf8 != L'\0') {
      sVar5 = strlen(p);
      logprintf(" [");
      if (sVar5 != 0) {
        uVar7 = 0;
        pbVar6 = (byte *)p;
        do {
          bVar1 = *pbVar6;
          if (bVar1 == 0) break;
          bVar2 = _utf8_to_unicode_utf8_count[bVar1];
          if ((sVar5 < (ulong)(long)(char)bVar2) || (3 < bVar2 - 1)) {
LAB_00105a24:
            logprintf("]");
            logprintf(" (count %d",(ulong)uVar7);
            logprintf(",unknown %d bytes",sVar5);
            goto LAB_00105a53;
          }
          switch((uint)bVar2) {
          case 1:
            uVar4 = bVar1 & 0x7f;
            lVar8 = 1;
            break;
          case 2:
            if ((pbVar6[1] & 0xffffffc0) != 0x80) goto LAB_00105a24;
            uVar4 = pbVar6[1] & 0x3f | (bVar1 & 0x1f) << 6;
            lVar8 = 2;
            break;
          case 3:
            if (((((int)(char)pbVar6[1] & 0xc0U) != 0x80) || ((pbVar6[2] & 0xffffffc0) != 0x80)) ||
               (uVar4 = ((int)(char)pbVar6[1] & 0x3fU) << 6 | (bVar1 & 0xf) << 0xc, uVar4 < 0x800))
            goto LAB_00105a24;
            uVar4 = pbVar6[2] & 0x3f | uVar4;
            lVar8 = 3;
            break;
          case 4:
            if ((((3 < sVar5) && (((int)(char)pbVar6[1] & 0xc0U) == 0x80)) &&
                (((int)(char)pbVar6[2] & 0xc0U) == 0x80)) && ((pbVar6[3] & 0xffffffc0) == 0x80)) {
              uVar9 = (bVar1 & 7) * 0x40000;
              uVar4 = ((int)(char)pbVar6[1] & 0x3fU) * 0x1000;
              if (0xffefffff < (uVar4 + uVar9) - 0x110000) {
                uVar4 = pbVar6[3] & 0x3f | ((int)(char)pbVar6[2] & 0x3fU) << 6 | uVar4 | uVar9;
                lVar8 = 4;
                break;
              }
            }
            goto LAB_00105a24;
          }
          if (pbVar6 != (byte *)p) {
            logprintf(" ");
          }
          logprintf("%04X",(ulong)uVar4);
          pbVar6 = pbVar6 + lVar8;
          uVar7 = uVar7 + 1;
          sVar5 = sVar5 - lVar8;
        } while (sVar5 != 0);
      }
      logprintf("]");
      logprintf(" (count %d",(ulong)uVar7);
LAB_00105a53:
      logprintf(")");
      pcVar10 = "\n";
    }
  }
  logprintf(pcVar10);
  return;
}

Assistant:

static void strdump(const char *e, const char *p, int ewidth, int utf8)
{
	const char *q = p;

	logprintf("      %*s = ", ewidth, e);
	if (p == NULL) {
		logprintf("NULL\n");
		return;
	}
	logprintf("\"");
	while (*p != '\0') {
		unsigned int c = 0xff & *p++;
		switch (c) {
		case '\a': printf("\a"); break;
		case '\b': printf("\b"); break;
		case '\n': printf("\n"); break;
		case '\r': printf("\r"); break;
		default:
			if (c >= 32 && c < 127)
				logprintf("%c", c);
			else
				logprintf("\\x%02X", c);
		}
	}
	logprintf("\"");
	logprintf(" (length %d)", q == NULL ? -1 : (int)strlen(q));

	/*
	 * If the current string is UTF-8, dump its code points.
	 */
	if (utf8) {
		size_t len;
		uint32_t uc;
		int n;
		int cnt = 0;

		p = q;
		len = strlen(p);
		logprintf(" [");
		while ((n = _utf8_to_unicode(&uc, p, len)) > 0) {
			if (p != q)
				logprintf(" ");
			logprintf("%04X", uc);
			p += n;
			len -= n;
			cnt++;
		}
		logprintf("]");
		logprintf(" (count %d", cnt);
		if (n < 0) {
			logprintf(",unknown %d bytes", len);
		}
		logprintf(")");

	}
	logprintf("\n");
}